

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# askselectobj.cpp
# Opt level: O1

Am_Object am_askselectobj_Initialize(void)

{
  Am_Object *pAVar1;
  Am_Wrapper *pAVar2;
  Am_Constraint *pAVar3;
  Am_Object *pAVar4;
  Am_Value_List *pAVar5;
  Am_Object_Data *in_RDI;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value_List local_30;
  
  Am_Object::Create((Am_Object *)&local_30,(char *)&Am_Window);
  pAVar1 = Am_Object::Set((Am_Object *)&local_30,0x89,
                          Am_Default_Pop_Up_Window_Destroy_Method.from_wrapper,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar1 = Am_Object::Set(pAVar1,0x6a,pAVar2,0);
  pAVar1 = Am_Object::Set(pAVar1,0x6c,"Select Objects",0);
  pAVar1 = Am_Object::Set(pAVar1,0x6d,"Select Objects",0);
  pAVar1 = Am_Object::Set(pAVar1,0x66,0x17c,0);
  pAVar1 = Am_Object::Set(pAVar1,0x67,100,0);
  Am_Object::operator=(&am_askselectobj,pAVar1);
  Am_Object::~Am_Object((Am_Object *)&local_30);
  Am_Object::Create(&local_40,(char *)&Am_Text);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar1 = Am_Object::Set(&local_40,100,pAVar3,0);
  pAVar1 = Am_Object::Set(pAVar1,0x65,0x10,0);
  pAVar1 = Am_Object::Set(pAVar1,0x66,0x15e,0);
  pAVar1 = Am_Object::Set(pAVar1,0x67,0xf,0);
  pAVar1 = Am_Object::Set(pAVar1,0xab,"Please select one or more objects and then hit OK,",0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar1 = Am_Object::Set(pAVar1,0x6b,pAVar2,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar1 = Am_Object::Set(pAVar1,0x6a,pAVar2,0);
  Am_Object::Am_Object(&local_38,pAVar1);
  pAVar1 = Am_Object::Add_Part(&am_askselectobj,&local_38,true,0);
  Am_Object::Create(&local_50,(char *)&Am_Text);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar4 = Am_Object::Set(&local_50,100,pAVar3,0);
  pAVar4 = Am_Object::Set(pAVar4,0x65,0x20,0);
  pAVar4 = Am_Object::Set(pAVar4,0x66,0x12d,0);
  pAVar4 = Am_Object::Set(pAVar4,0x67,0xf,0);
  pAVar4 = Am_Object::Set(pAVar4,0xab,"or hit Cancel to stop executing the script.",0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar4 = Am_Object::Set(pAVar4,0x6b,pAVar2,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar4 = Am_Object::Set(pAVar4,0x6a,pAVar2,0);
  Am_Object::Am_Object(&local_48,pAVar4);
  pAVar1 = Am_Object::Add_Part(pAVar1,&local_48,true,0);
  Am_Object::Create(&local_60,(char *)&Am_Button_Panel);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar4 = Am_Object::Set(&local_60,100,pAVar3,0);
  pAVar4 = Am_Object::Set(pAVar4,0x65,0x37,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar4 = Am_Object::Set(pAVar4,0x6a,pAVar2,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar4 = Am_Object::Set(pAVar4,0x94,pAVar3,0);
  pAVar4 = Am_Object::Set(pAVar4,0x95,10,0);
  pAVar4 = Am_Object::Set(pAVar4,0x96,0,0);
  pAVar4 = Am_Object::Set(pAVar4,0x9c,0,0);
  Am_Value_List::Am_Value_List(&local_30);
  Am_Object::Create(&local_68,(char *)&Am_Standard_OK_Command);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
  pAVar5 = Am_Value_List::Add(&local_30,pAVar2,Am_TAIL,true);
  Am_Object::Create(&local_70,(char *)&Am_Standard_Cancel_Command);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar2,Am_TAIL,true);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar4 = Am_Object::Set(pAVar4,0xa2,pAVar2,0);
  Am_Object::Am_Object(&local_58,pAVar4);
  Am_Object::Add_Part(pAVar1,&local_58,true,0);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Value_List::~Am_Value_List(&local_30);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object((Am_Object *)in_RDI,&am_askselectobj);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object
am_askselectobj_Initialize()
{
  am_askselectobj = Am_Window.Create(DSTR("askselectobj"))
                        .Set(Am_DESTROY_WINDOW_METHOD,
                             Am_Default_Pop_Up_Window_Destroy_Method)
                        .Set(Am_FILL_STYLE, Am_Default_Color)
                        .Set(Am_TITLE, "Select Objects")
                        .Set(Am_ICON_TITLE, "Select Objects")
                        .Set(Am_WIDTH, 380)
                        .Set(Am_HEIGHT, 100);
  am_askselectobj
      .Add_Part(Am_Text.Create()
                    .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                    .Set(Am_TOP, 16)
                    .Set(Am_WIDTH, 350)
                    .Set(Am_HEIGHT, 15)
                    .Set(Am_TEXT,
                         "Please select one or more objects and then hit OK,")
                    .Set(Am_LINE_STYLE, Am_Black)
                    .Set(Am_FILL_STYLE, Am_No_Style))
      .Add_Part(Am_Text.Create()
                    .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                    .Set(Am_TOP, 32)
                    .Set(Am_WIDTH, 301)
                    .Set(Am_HEIGHT, 15)
                    .Set(Am_TEXT, "or hit Cancel to stop executing the script.")
                    .Set(Am_LINE_STYLE, Am_Black)
                    .Set(Am_FILL_STYLE, Am_No_Style))
      .Add_Part(
          Am_Button_Panel.Create()
              .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
              .Set(Am_TOP, 55)
              .Set(Am_FILL_STYLE, Am_Default_Color)
              .Set(Am_LAYOUT, Am_Horizontal_Layout)
              .Set(Am_H_SPACING, 10)
              .Set(Am_V_SPACING, 0)
              .Set(Am_MAX_RANK, 0)
              .Set(Am_ITEMS, Am_Value_List()
                                 .Add(Am_Standard_OK_Command.Create())
                                 .Add(Am_Standard_Cancel_Command.Create())));
  return am_askselectobj;
}